

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicKey.cpp
# Opt level: O2

int jbcoin::verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  int iVar2;
  reference_const_type pKVar3;
  uchar *puVar4;
  undefined7 extraout_var;
  long lVar5;
  optional<jbcoin::KeyType> type;
  uint8_t Order [32];
  type local_70;
  result_type local_68;
  uchar local_48 [32];
  
  local_70 = (type)publicKeyType((PublicKey *)ctx);
  if (((ulong)local_70 & 1) != 0) {
    pKVar3 = boost::optional<jbcoin::KeyType>::get((optional<jbcoin::KeyType> *)&local_70);
    if (*pKVar3 == secp256k1) {
      sha512Half<jbcoin::Slice>(&local_68,(Slice *)sig);
      bVar1 = verifyDigest((PublicKey *)ctx,&local_68,(Slice *)siglen,SUB81(tbs,0));
      return (int)CONCAT71(extraout_var,bVar1);
    }
    pKVar3 = boost::optional<jbcoin::KeyType>::get((optional<jbcoin::KeyType> *)&local_70);
    if ((*pKVar3 == ed25519) && (*(long *)(siglen + 8) == 0x40)) {
      local_68.pn[4] = 0xdef9de14;
      local_68.pn[5] = 0xd69cf7a2;
      local_68.pn[6] = 0x1a631258;
      local_68.pn[7] = 0xedd3f55c;
      local_68.pn[0] = 0x10;
      local_68.pn[1] = 0;
      local_68.pn[2] = 0;
      local_68.pn[3] = 0;
      puVar4 = (uchar *)(*(long *)siglen + 0x3f);
      for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
        local_48[lVar5] = *puVar4;
        puVar4 = puVar4 + -1;
      }
      bVar1 = std::__lexicographical_compare<true>::__lc<unsigned_char,unsigned_char>
                        (local_48,&stack0xffffffffffffffd8,(uchar *)&local_68,local_48);
      if (bVar1) {
        iVar2 = ed25519_sign_open(*(uchar **)sig,*(size_t *)(sig + 8),(uchar *)(ctx + 9),
                                  *(uchar **)siglen);
        return CONCAT31((int3)((uint)iVar2 >> 8),iVar2 == 0);
      }
    }
  }
  return 0;
}

Assistant:

bool
verify (PublicKey const& publicKey,
    Slice const& m,
    Slice const& sig,
    bool mustBeFullyCanonical)
{
    if (auto const type = publicKeyType(publicKey))
    {
        if (*type == KeyType::secp256k1)
        {
            return verifyDigest (publicKey,
                sha512Half(m), sig, mustBeFullyCanonical);
        }
        else if (*type == KeyType::ed25519)
        {
            if (! ed25519Canonical(sig))
                return false;

            // We internally prefix Ed25519 keys with a 0xED
            // byte to distinguish them from secp256k1 keys
            // so when verifying the signature, we need to
            // first strip that prefix.
            return ed25519_sign_open(
                m.data(), m.size(), publicKey.data() + 1,
                    sig.data()) == 0;
        }
    }
    return false;
}